

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericunixtheme.cpp
# Opt level: O0

QList<QSize> * QGenericUnixTheme::availableXdgFileIconSizes(void)

{
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  char16_t *str;
  DataPointer *in_stack_ffffffffffffff68;
  State in_stack_ffffffffffffff80;
  Mode mode;
  QIcon *this;
  char16_t *name;
  QArrayDataPointer<char16_t> local_40 [2];
  QIcon local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  name = L"inode-directory";
  mode = Normal;
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_40,(Data *)0x0,L"inode-directory",0xf);
  QString::QString((QString *)in_RDI,in_stack_ffffffffffffff68);
  this = &local_10;
  QIcon::fromTheme((QString *)name);
  QIcon::availableSizes(this,mode,in_stack_ffffffffffffff80);
  QIcon::~QIcon((QIcon *)in_RDI);
  QString::~QString((QString *)0xae5271);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QList<QSize> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<QSize> QGenericUnixTheme::availableXdgFileIconSizes()
{
    return QIcon::fromTheme(QStringLiteral("inode-directory")).availableSizes();
}